

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

void __thiscall FTraceInfo::EnterLinePortal(FTraceInfo *this,FPathTraverse *pt,intercept_t *in)

{
  bool *pbVar1;
  line_t_conflict *src;
  FTraceResults *pFVar2;
  subsector_t *psVar3;
  FLinePortal *pFVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  DVector3 exit;
  double local_48;
  double local_40;
  double local_38;
  
  src = (in->d).line;
  pFVar4 = linePortals.Array + src->portalindex;
  if (linePortals.Count <= src->portalindex) {
    pFVar4 = (FLinePortal *)0x0;
  }
  dVar6 = in->frac + 1.52587890625e-05;
  dVar5 = in->frac * this->MaxDist;
  dVar7 = this->MaxDist * dVar6;
  local_48 = (this->Vec).X * dVar5 + (this->Start).X;
  local_40 = (this->Vec).Y * dVar5 + (this->Start).Y;
  local_38 = dVar5 * (this->Vec).Z + (this->Start).Z;
  P_TranslatePortalXY(src,(double *)this,&(this->Start).Y);
  P_TranslatePortalZ(src,&(this->Start).Z);
  P_TranslatePortalVXVY(src,&(this->Vec).X,&(this->Vec).Y);
  P_TranslatePortalZ(src,&this->limitz);
  psVar3 = P_PointInSubsector((this->Vec).X * dVar7 + (this->Start).X,
                              (this->Vec).Y * dVar7 + (this->Start).Y);
  this->CurSector = psVar3->sector;
  this->EnterDist = dVar7;
  this->inshootthrough = 1;
  this->startfrac = dVar6;
  pbVar1 = &this->Results->unlinked;
  *pbVar1 = (bool)(*pbVar1 | pFVar4->mType != '\x03');
  FPathTraverse::PortalRelocate(pt,in,this->ptflags,(DVector3 *)0x0);
  if (((this->TraceFlags & 0x10) != 0) &&
     (this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0)) {
    pFVar2 = this->Results;
    pFVar2->HitType = TRACE_CrossingPortal;
    (pFVar2->HitPos).Z = local_38;
    (pFVar2->HitPos).Y = local_40;
    (pFVar2->HitPos).X = local_48;
    P_TranslatePortalXY(src,&local_48,&local_40);
    P_TranslatePortalZ(src,&local_38);
    pFVar2 = this->Results;
    (pFVar2->SrcFromTarget).Z = local_38;
    (pFVar2->SrcFromTarget).Y = local_40;
    (pFVar2->SrcFromTarget).X = local_48;
    (pFVar2->HitVector).Z = (this->Vec).Z;
    (pFVar2->HitVector).Y = (this->Vec).Y;
    (pFVar2->HitVector).X = (this->Vec).X;
    (*this->TraceCallback)(pFVar2,this->TraceCallbackData);
  }
  return;
}

Assistant:

void FTraceInfo::EnterLinePortal(FPathTraverse &pt, intercept_t *in)
{
	line_t *li = in->d.line;
	FLinePortal *port = li->getPortal();

	double frac = in->frac + EQUAL_EPSILON;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + MaxDist * in->frac * Vec;

	P_TranslatePortalXY(li, Start.X, Start.Y);
	P_TranslatePortalZ(li, Start.Z);
	P_TranslatePortalVXVY(li, Vec.X, Vec.Y);
	P_TranslatePortalZ(li, limitz);

	CurSector = P_PointInSector(Start + enterdist * Vec);
	EnterDist = enterdist;
	inshootthrough = true;
	startfrac = frac;
	Results->unlinked |= (port->mType != PORTT_LINKED);
	pt.PortalRelocate(in, ptflags);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * in->frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		P_TranslatePortalXY(li, exit.X, exit.Y);
		P_TranslatePortalZ(li, exit.Z);
		Results->SrcFromTarget = exit;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}
}